

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_property.cpp
# Opt level: O1

void tst_bounded_property(void)

{
  _Any_data *t;
  ostream *poVar1;
  _Any_data *p_Var2;
  undefined1 local_f8 [28];
  undefined4 local_dc;
  undefined4 local_d8;
  undefined1 local_d0 [28];
  undefined4 local_b4;
  undefined4 local_b0;
  undefined1 local_a8 [28];
  undefined4 local_8c;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  undefined1 local_60 [32];
  undefined1 local_40 [15];
  undefined1 local_31 [8];
  bool called;
  
  local_d8 = 0;
  local_d0._0_8_ = (pointer)0x0;
  local_d0._8_4_ = 0;
  local_d0._12_4_ = 0;
  local_d0._16_4_ = 0;
  local_d0._20_8_ = 0;
  local_b4 = 0x3f800000;
  local_b0 = 0x3f800000;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_4_ = 0;
  local_a8._20_8_ = 0;
  local_8c = 0x3f800000;
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_4_ = 0;
  local_f8._12_4_ = 0;
  local_f8._16_4_ = 0;
  local_f8._20_8_ = 0;
  local_dc = 0x3f800000;
  local_60._0_4_ = 0.0;
  t = (_Any_data *)(local_40 + 4);
  local_60._8_8_ = (pointer)0x0;
  local_60._16_4_ = 0;
  local_60._20_4_ = 0;
  local_60._24_4_ = 0;
  stack0xffffffffffffffbc = 0;
  local_40._4_4_ = 1.0;
  rengine::Property<float>::set((Property<float> *)local_60,(float *)t);
  if (((float)local_60._0_4_ != 1.0) || (NAN((float)local_60._0_4_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    poVar1 = std::ostream::_M_insert<double>((double)(float)local_60._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' vs \'",6);
    poVar1 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (((float)local_60._0_4_ != 1.0) || (NAN((float)local_60._0_4_))) {
      __assert_fail("(v) == (1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x39,"void tst_bounded_property()");
    }
  }
  p_Var2 = &local_88;
  if ((float)local_40._4_4_ < 10.0) {
    p_Var2 = t;
  }
  local_88._0_4_ = 0x41200000;
  if (10.0 < (float)local_40._0_4_) {
    p_Var2 = (_Any_data *)local_40;
  }
  rengine::Property<float>::set((Property<float> *)local_60,(float *)p_Var2);
  if (((float)local_60._0_4_ != 1.0) || (NAN((float)local_60._0_4_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    poVar1 = std::ostream::_M_insert<double>((double)(float)local_60._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' vs \'",6);
    poVar1 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (((float)local_60._0_4_ != 1.0) || (NAN((float)local_60._0_4_))) {
      __assert_fail("(v) == (1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x3b,"void tst_bounded_property()");
    }
  }
  p_Var2 = &local_88;
  if ((float)local_40._4_4_ < -10.0) {
    p_Var2 = t;
  }
  local_88._0_4_ = 0xc1200000;
  if (-10.0 < (float)local_40._0_4_) {
    p_Var2 = (_Any_data *)local_40;
  }
  rengine::Property<float>::set((Property<float> *)local_60,(float *)p_Var2);
  if (((float)local_60._0_4_ != 0.0) || (NAN((float)local_60._0_4_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    poVar1 = std::ostream::_M_insert<double>((double)(float)local_60._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' vs \'",6);
    poVar1 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (((float)local_60._0_4_ != 0.0) || (NAN((float)local_60._0_4_))) {
      __assert_fail("(v) == (0.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x3d,"void tst_bounded_property()");
    }
  }
  p_Var2 = &local_88;
  if ((float)local_40._4_4_ < -10.0) {
    p_Var2 = t;
  }
  local_88._0_4_ = 0xc1200000;
  if (-10.0 < (float)local_40._0_4_) {
    p_Var2 = (_Any_data *)local_40;
  }
  rengine::Property<float>::set((Property<float> *)local_60,(float *)p_Var2);
  if (((float)local_60._0_4_ != 0.0) || (NAN((float)local_60._0_4_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    poVar1 = std::ostream::_M_insert<double>((double)(float)local_60._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' vs \'",6);
    poVar1 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (((float)local_60._0_4_ != 0.0) || (NAN((float)local_60._0_4_))) {
      __assert_fail("(v) == (0.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x3f,"void tst_bounded_property()");
    }
  }
  p_Var2 = &local_88;
  if ((float)local_40._4_4_ < 0.0) {
    p_Var2 = t;
  }
  local_31[0] = '\0';
  local_88._M_unused._M_member_pointer = local_88._M_unused._M_member_pointer & 0xffffffff00000000;
  if (0.0 < (float)local_40._0_4_) {
    p_Var2 = (_Any_data *)local_40;
  }
  rengine::Property<float>::set((Property<float> *)local_60,(float *)p_Var2);
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = local_31;
  pcStack_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp:68:15)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp:68:15)>
             ::_M_manager;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
             (local_60 + 8),(value_type *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  p_Var2 = &local_88;
  if ((float)local_40._4_4_ < 0.5) {
    p_Var2 = t;
  }
  local_88._0_4_ = 0x3f000000;
  if (0.5 < (float)local_40._0_4_) {
    p_Var2 = (_Any_data *)local_40;
  }
  rengine::Property<float>::set((Property<float> *)local_60,(float *)p_Var2);
  if (((float)local_60._0_4_ != 0.5) || (NAN((float)local_60._0_4_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    poVar1 = std::ostream::_M_insert<double>((double)(float)local_60._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' vs \'",6);
    poVar1 = std::ostream::_M_insert<double>(0.5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (((float)local_60._0_4_ != 0.5) || (NAN((float)local_60._0_4_))) {
      __assert_fail("(v) == (0.5f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x47,"void tst_bounded_property()");
    }
  }
  if (local_31[0] == '\0') {
    __assert_fail("called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                  ,0x48,"void tst_bounded_property()");
  }
  p_Var2 = &local_88;
  if ((float)local_40._4_4_ < -1.0) {
    p_Var2 = t;
  }
  local_31[0] = '\0';
  local_88._0_4_ = 0xbf800000;
  if (-1.0 < (float)local_40._0_4_) {
    p_Var2 = (_Any_data *)local_40;
  }
  rengine::Property<float>::set((Property<float> *)local_60,(float *)p_Var2);
  if (((float)local_60._0_4_ != 0.0) || (NAN((float)local_60._0_4_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    poVar1 = std::ostream::_M_insert<double>((double)(float)local_60._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' vs \'",6);
    poVar1 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (((float)local_60._0_4_ != 0.0) || (NAN((float)local_60._0_4_))) {
      __assert_fail("(v) == (0.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x4c,"void tst_bounded_property()");
    }
  }
  if (local_31[0] == '\0') {
    __assert_fail("called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                  ,0x4d,"void tst_bounded_property()");
  }
  p_Var2 = &local_88;
  if ((float)local_40._4_4_ < -2.0) {
    p_Var2 = t;
  }
  local_31[0] = '\0';
  local_88._0_4_ = 0xc0000000;
  if (-2.0 < (float)local_40._0_4_) {
    p_Var2 = (_Any_data *)local_40;
  }
  rengine::Property<float>::set((Property<float> *)local_60,(float *)p_Var2);
  if (((float)local_60._0_4_ != 0.0) || (NAN((float)local_60._0_4_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    poVar1 = std::ostream::_M_insert<double>((double)(float)local_60._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' vs \'",6);
    poVar1 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (((float)local_60._0_4_ != 0.0) || (NAN((float)local_60._0_4_))) {
      __assert_fail("(v) == (0.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x51,"void tst_bounded_property()");
    }
  }
  if (local_31[0] == '\x01') {
    __assert_fail("!called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                  ,0x52,"void tst_bounded_property()");
  }
  p_Var2 = &local_88;
  if ((float)local_40._4_4_ < 10.0) {
    p_Var2 = t;
  }
  local_31[0] = '\0';
  local_88._0_4_ = 0x41200000;
  if (10.0 < (float)local_40._0_4_) {
    p_Var2 = (_Any_data *)local_40;
  }
  rengine::Property<float>::set((Property<float> *)local_60,(float *)p_Var2);
  if (((float)local_60._0_4_ != 1.0) || (NAN((float)local_60._0_4_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    poVar1 = std::ostream::_M_insert<double>((double)(float)local_60._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' vs \'",6);
    poVar1 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (((float)local_60._0_4_ != 1.0) || (NAN((float)local_60._0_4_))) {
      __assert_fail("(v) == (1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x56,"void tst_bounded_property()");
    }
  }
  if (local_31[0] == '\0') {
    __assert_fail("called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                  ,0x57,"void tst_bounded_property()");
  }
  p_Var2 = &local_88;
  if ((float)local_40._4_4_ < 100.0) {
    p_Var2 = t;
  }
  local_31[0] = '\0';
  local_88._0_4_ = 0x42c80000;
  if (100.0 < (float)local_40._0_4_) {
    p_Var2 = (_Any_data *)local_40;
  }
  rengine::Property<float>::set((Property<float> *)local_60,(float *)p_Var2);
  if (((float)local_60._0_4_ != 1.0) || (NAN((float)local_60._0_4_))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    poVar1 = std::ostream::_M_insert<double>((double)(float)local_60._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' vs \'",6);
    poVar1 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (((float)local_60._0_4_ != 1.0) || (NAN((float)local_60._0_4_))) {
      __assert_fail("(v) == (1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                    ,0x5b,"void tst_bounded_property()");
    }
  }
  if (local_31[0] != '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"void tst_bounded_property()",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ok",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
              ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
               (local_60 + 8));
    std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
              ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)local_f8)
    ;
    std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
              ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)local_a8)
    ;
    std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
              ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)local_d0)
    ;
    return;
  }
  __assert_fail("!called",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_property.cpp"
                ,0x5c,"void tst_bounded_property()");
}

Assistant:

void tst_bounded_property()
{
    BoundedProperty<float> float_under { 0.0f, 1.0f, -2.0f };
    check_equal(float_under, 0.0f);

    BoundedProperty<float> float_over { 0.0f, 1.0f, 2.0f };
    check_equal(float_over, 1.0f)

    BoundedProperty<float> float_valid { 0.0f, 1.0f, 0.5f };
    check_equal(float_valid, 0.5f);

    BoundedProperty<float> v(0.0f, 1.0f);
    check_equal(v, 0.0f);

    // Check setters
    v.set(10.0f);
    check_equal(v, 1.0f);
    v = 10.0f;
    check_equal(v, 1.0f);
    v.set(-10.0f);
    check_equal(v, 0.0f);
    v = -10.0f;
    check_equal(v, 0.0f);

    // Check that notifiers are called only when inside range
    bool called = false;
    v = 0.0f;
    v.connect([&]() { called = true; });

    v = 0.5f;
    check_equal(v, 0.5f);
    check_true(called);

    called = false;
    v = -1.0f;
    check_equal(v, 0.0f);
    check_true(called);

    called = false;
    v = -2.0f;
    check_equal(v, 0.0f);
    check_true(!called);

    called = false;
    v = 10.0f;
    check_equal(v, 1.0f);
    check_true(called);

    called = false;
    v = 100.0f;
    check_equal(v, 1.0f);
    check_true(!called);

    cout << __PRETTY_FUNCTION__ << ": ok" << endl;
}